

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threading_atomic_ref_count.h
# Opt level: O0

int threading_atomic_ref_count_increment(threading_atomic_ref_count ref)

{
  bool bVar1;
  threading_atomic_ref_count ref_local;
  uint local_4;
  
  bVar1 = ref->count != 0xffffffffffffffff;
  if (bVar1) {
    LOCK();
    ref->count = ref->count + 1;
    UNLOCK();
  }
  local_4 = (uint)!bVar1;
  return local_4;
}

Assistant:

static inline int threading_atomic_ref_count_increment(threading_atomic_ref_count ref)
{
#if defined(__THREAD_SANITIZER__)
	threading_mutex_lock(&ref->m);
	{
		++ref->count;
	}
	threading_mutex_unlock(&ref->m);
#else
	if (atomic_load_explicit(&ref->count, memory_order_relaxed) == THREADING_ATOMIC_REF_COUNT_MAX)
	{
		return 1;
	}

	atomic_fetch_add_explicit(&ref->count, 1, memory_order_relaxed);
#endif

	return 0;
}